

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

string * __thiscall
Omega_h::get_full_name_abi_cxx11_(string *__return_storage_ptr__,Omega_h *this,Input *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Input *input_00;
  uint __val;
  uint uVar2;
  uint uVar3;
  long lVar4;
  InputList *this_00;
  InputMap *this_01;
  string *psVar5;
  uint uVar6;
  ulong uVar7;
  uint __len;
  Input *ptr_in;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  input_00 = *(Input **)(this + 8);
  if (input_00 != (Input *)0x0) {
    get_full_name_abi_cxx11_(&local_50,(Omega_h *)input_00,input);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar4 = __dynamic_cast(input_00,&Input::typeinfo,&InputList::typeinfo,0);
    if (lVar4 == 0) {
      lVar4 = __dynamic_cast(input_00,&Input::typeinfo,&InputMap::typeinfo,0);
      if (lVar4 != 0) {
        this_01 = as_type<Omega_h::InputMap>(input_00);
        psVar5 = InputMap::name_abi_cxx11_(this_01,(Input *)this);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(psVar5->_M_dataplus)._M_p);
      }
    }
    else {
      this_00 = as_type<Omega_h::InputList>(input_00);
      uVar3 = InputList::position(this_00,(Input *)this);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      __val = -uVar3;
      if (0 < (int)uVar3) {
        __val = uVar3;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar6 = (uint)uVar7;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_002e9f1e;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_002e9f1e;
          }
          if (uVar6 < 10000) goto LAB_002e9f1e;
          uVar7 = uVar7 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar6);
        __len = __len + 1;
      }
LAB_002e9f1e:
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_50._M_dataplus._M_p + (uVar3 >> 0x1f),__len,__val);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_full_name(Input const& input) {
  std::string full_name;
  if (input.parent != nullptr) {
    auto& parent = *(input.parent);
    full_name = get_full_name(parent);
    if (is_type<InputList>(parent)) {
      auto i = as_type<InputList>(parent).position(input);
      full_name += "[";
      full_name += std::to_string(i);
      full_name += "]";
    } else if (is_type<InputMap>(parent)) {
      auto& name = as_type<InputMap>(parent).name(input);
      full_name += ".";
      full_name += name;
    }
  }
  return full_name;
}